

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cc
# Opt level: O3

symNodePtr __thiscall dh::symTab::research_elem_global(symTab *this,string *c)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  symNodePtr sVar3;
  symNodePtr tmp_ptr;
  long local_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  sVar3 = research_elem((symTab *)&stack0xffffffffffffffd0,c);
  peVar1 = local_28;
  _Var2 = sVar3.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_30 == 0) {
    if ((string *)c->_M_string_length == (string *)0x0) {
      *(undefined8 *)this = 0;
      (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      sVar3 = research_elem_global(this,(string *)c->_M_string_length);
      _Var2 = sVar3.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
    }
  }
  else {
    *(long *)this = local_30;
    local_28 = (element_type *)0x0;
    (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    local_30 = 0;
  }
  if (local_28 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (symNodePtr)sVar3.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

symNodePtr symTab::research_elem_global( const ::std::string& c)
{
	auto tmp_ptr = research_elem(c);
	if ( tmp_ptr == nullptr)
	{
		if ( this->upper_tab == nullptr)
		{
			return nullptr;
		}
		return this->upper_tab->research_elem_global(c);
	} else 
	{
		return tmp_ptr;
	}
}